

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O0

FT_Error FT_Bitmap_Convert(FT_Library library,FT_Bitmap *source,FT_Bitmap *target,FT_Int alignment)

{
  byte bVar1;
  FT_Memory memory_00;
  FT_Byte FVar2;
  uint uVar3;
  uchar *puVar4;
  int iVar5;
  bool bVar6;
  int local_e0;
  int local_dc;
  uint local_d4;
  FT_Byte *pFStack_d0;
  FT_UInt j_3;
  FT_Byte *tt_3;
  FT_Byte *ss_3;
  FT_UInt i_4;
  FT_Int val_4;
  FT_UInt j_2;
  FT_Byte *tt_2;
  FT_Byte *ss_2;
  FT_UInt i_3;
  FT_Int val_3;
  FT_Int val_2;
  FT_UInt j_1;
  FT_Byte *tt_1;
  FT_Byte *ss_1;
  FT_UInt i_2;
  FT_UInt i_1;
  FT_UInt width_1;
  FT_Int val_1;
  FT_Int val;
  FT_UInt j;
  FT_Byte *tt;
  FT_Byte *ss;
  FT_UInt i;
  FT_Int rem;
  FT_Int neg;
  FT_Int width;
  FT_Byte *t;
  FT_Byte *s;
  FT_Memory memory;
  FT_Error error;
  FT_Int alignment_local;
  FT_Bitmap *target_local;
  FT_Bitmap *source_local;
  FT_Library library_local;
  
  memory._0_4_ = 0;
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if ((source == (FT_Bitmap *)0x0) || (target == (FT_Bitmap *)0x0)) {
    library_local._4_4_ = 6;
  }
  else {
    memory_00 = library->memory;
    memory._4_4_ = alignment;
    _error = target;
    target_local = source;
    source_local = (FT_Bitmap *)library;
    if (source->pixel_mode - 1 < 7) {
      rem = source->width;
      if ((target->pitch != 0) || (bVar6 = true, -1 < source->pitch)) {
        bVar6 = target->pitch < 0;
      }
      FT_Bitmap_Done(library,target);
      _error->pixel_mode = '\x02';
      _error->rows = target_local->rows;
      _error->width = target_local->width;
      if ((memory._4_4_ != 0) && (iVar5 = rem % memory._4_4_, iVar5 != 0)) {
        if (memory._4_4_ < 1) {
          local_dc = (rem - iVar5) - memory._4_4_;
        }
        else {
          local_dc = (rem - iVar5) + memory._4_4_;
        }
        rem = local_dc;
      }
      puVar4 = (uchar *)ft_mem_qrealloc(memory_00,(long)rem,0,(ulong)_error->rows,(void *)0x0,
                                        (FT_Error *)&memory);
      _error->buffer = puVar4;
      if ((int)memory != 0) {
        return (int)memory;
      }
      if (bVar6) {
        local_e0 = -rem;
      }
      else {
        local_e0 = rem;
      }
      _error->pitch = local_e0;
    }
    else {
      memory._0_4_ = 6;
    }
    t = target_local->buffer;
    _neg = _error->buffer;
    if (target_local->pitch < 0) {
      t = t + -(long)(int)(target_local->pitch * (target_local->rows - 1));
    }
    if (_error->pitch < 0) {
      _neg = _neg + -(long)(int)(_error->pitch * (_error->rows - 1));
    }
    switch(target_local->pixel_mode) {
    case '\x01':
      _error->num_grays = 2;
      for (ss._0_4_ = target_local->rows; (uint)ss != 0; ss._0_4_ = (uint)ss - 1) {
        tt = t;
        _val = _neg;
        for (val_1 = target_local->width >> 3; val_1 != 0; val_1 = val_1 + -1) {
          bVar1 = *tt;
          uVar3 = (uint)bVar1;
          *_val = (FT_Byte)((int)(uVar3 & 0x80) >> 7);
          _val[1] = (FT_Byte)((int)(uVar3 & 0x40) >> 6);
          _val[2] = (FT_Byte)((int)(uVar3 & 0x20) >> 5);
          _val[3] = (FT_Byte)((int)(uVar3 & 0x10) >> 4);
          _val[4] = (FT_Byte)((int)(uVar3 & 8) >> 3);
          _val[5] = (FT_Byte)((int)(uVar3 & 4) >> 2);
          _val[6] = (FT_Byte)((int)(uVar3 & 2) >> 1);
          _val[7] = bVar1 & 1;
          _val = _val + 8;
          tt = tt + 1;
        }
        val_1 = target_local->width & 7;
        if (val_1 != 0) {
          i_1 = (FT_UInt)*tt;
          for (; val_1 != 0; val_1 = val_1 + -1) {
            *_val = (FT_Byte)((int)(i_1 & 0x80) >> 7);
            i_1 = i_1 << 1;
            _val = _val + 1;
          }
        }
        t = t + target_local->pitch;
        _neg = _neg + _error->pitch;
      }
      break;
    case '\x02':
    case '\x05':
    case '\x06':
      uVar3 = target_local->width;
      _error->num_grays = 0x100;
      for (ss_1._4_4_ = target_local->rows; ss_1._4_4_ != 0; ss_1._4_4_ = ss_1._4_4_ - 1) {
        memcpy(_neg,t,(ulong)uVar3);
        t = t + target_local->pitch;
        _neg = _neg + _error->pitch;
      }
      break;
    case '\x03':
      _error->num_grays = 4;
      for (ss_1._0_4_ = target_local->rows; (uint)ss_1 != 0; ss_1._0_4_ = (uint)ss_1 - 1) {
        tt_1 = t;
        _val_2 = _neg;
        for (val_3 = target_local->width >> 2; val_3 != 0; val_3 = val_3 + -1) {
          bVar1 = *tt_1;
          uVar3 = (uint)bVar1;
          *_val_2 = (FT_Byte)((int)(uVar3 & 0xc0) >> 6);
          _val_2[1] = (FT_Byte)((int)(uVar3 & 0x30) >> 4);
          _val_2[2] = (FT_Byte)((int)(uVar3 & 0xc) >> 2);
          _val_2[3] = bVar1 & 3;
          tt_1 = tt_1 + 1;
          _val_2 = _val_2 + 4;
        }
        val_3 = target_local->width & 3;
        if (val_3 != 0) {
          ss_2._4_4_ = (uint)*tt_1;
          for (; val_3 != 0; val_3 = val_3 + -1) {
            *_val_2 = (FT_Byte)((int)(ss_2._4_4_ & 0xc0) >> 6);
            ss_2._4_4_ = ss_2._4_4_ << 2;
            _val_2 = _val_2 + 1;
          }
        }
        t = t + target_local->pitch;
        _neg = _neg + _error->pitch;
      }
      break;
    case '\x04':
      _error->num_grays = 0x10;
      for (ss_2._0_4_ = target_local->rows; (uint)ss_2 != 0; ss_2._0_4_ = (uint)ss_2 - 1) {
        tt_2 = t;
        _val_4 = _neg;
        for (i_4 = target_local->width >> 1; i_4 != 0; i_4 = i_4 - 1) {
          bVar1 = *tt_2;
          *_val_4 = (FT_Byte)((int)(bVar1 & 0xf0) >> 4);
          _val_4[1] = bVar1 & 0xf;
          tt_2 = tt_2 + 1;
          _val_4 = _val_4 + 2;
        }
        if ((target_local->width & 1) != 0) {
          *_val_4 = (FT_Byte)((int)(*tt_2 & 0xf0) >> 4);
        }
        t = t + target_local->pitch;
        _neg = _neg + _error->pitch;
      }
      break;
    case '\a':
      _error->num_grays = 0x100;
      for (ss_3._4_4_ = target_local->rows; ss_3._4_4_ != 0; ss_3._4_4_ = ss_3._4_4_ - 1) {
        tt_3 = t;
        pFStack_d0 = _neg;
        for (local_d4 = target_local->width; local_d4 != 0; local_d4 = local_d4 - 1) {
          FVar2 = ft_gray_for_premultiplied_srgb_bgra(tt_3);
          *pFStack_d0 = FVar2;
          tt_3 = tt_3 + 4;
          pFStack_d0 = pFStack_d0 + 1;
        }
        t = t + target_local->pitch;
        _neg = _neg + _error->pitch;
      }
    }
    library_local._4_4_ = (int)memory;
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Convert( FT_Library        library,
                     const FT_Bitmap  *source,
                     FT_Bitmap        *target,
                     FT_Int            alignment )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Memory  memory;

    FT_Byte*  s;
    FT_Byte*  t;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !source || !target )
      return FT_THROW( Invalid_Argument );

    memory = library->memory;

    switch ( source->pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
    case FT_PIXEL_MODE_GRAY:
    case FT_PIXEL_MODE_GRAY2:
    case FT_PIXEL_MODE_GRAY4:
    case FT_PIXEL_MODE_LCD:
    case FT_PIXEL_MODE_LCD_V:
    case FT_PIXEL_MODE_BGRA:
      {
        FT_Int  width = (FT_Int)source->width;
        FT_Int  neg   = ( target->pitch == 0 && source->pitch < 0 ) ||
                          target->pitch  < 0;


        FT_Bitmap_Done( library, target );

        target->pixel_mode = FT_PIXEL_MODE_GRAY;
        target->rows       = source->rows;
        target->width      = source->width;

        if ( alignment )
        {
          FT_Int  rem = width % alignment;


          if ( rem )
            width = alignment > 0 ? width - rem + alignment
                                  : width - rem - alignment;
        }

        if ( FT_QALLOC_MULT( target->buffer, target->rows, width ) )
          return error;

        target->pitch = neg ? -width : width;
      }
      break;

    default:
      error = FT_THROW( Invalid_Argument );
    }

    s = source->buffer;
    t = target->buffer;

    /* take care of bitmap flow */
    if ( source->pitch < 0 )
      s -= source->pitch * (FT_Int)( source->rows - 1 );
    if ( target->pitch < 0 )
      t -= target->pitch * (FT_Int)( target->rows - 1 );

    switch ( source->pixel_mode )
    {
    case FT_PIXEL_MODE_MONO:
      {
        FT_UInt  i;


        target->num_grays = 2;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 3; j > 0; j-- )
          {
            FT_Int  val = ss[0]; /* avoid a byte->int cast on each line */


            tt[0] = (FT_Byte)( ( val & 0x80 ) >> 7 );
            tt[1] = (FT_Byte)( ( val & 0x40 ) >> 6 );
            tt[2] = (FT_Byte)( ( val & 0x20 ) >> 5 );
            tt[3] = (FT_Byte)( ( val & 0x10 ) >> 4 );
            tt[4] = (FT_Byte)( ( val & 0x08 ) >> 3 );
            tt[5] = (FT_Byte)( ( val & 0x04 ) >> 2 );
            tt[6] = (FT_Byte)( ( val & 0x02 ) >> 1 );
            tt[7] = (FT_Byte)(   val & 0x01 );

            tt += 8;
            ss += 1;
          }

          /* get remaining pixels (if any) */
          j = source->width & 7;
          if ( j > 0 )
          {
            FT_Int  val = *ss;


            for ( ; j > 0; j-- )
            {
              tt[0] = (FT_Byte)( ( val & 0x80 ) >> 7);
              val <<= 1;
              tt   += 1;
            }
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY:
    case FT_PIXEL_MODE_LCD:
    case FT_PIXEL_MODE_LCD_V:
      {
        FT_UInt  width = source->width;
        FT_UInt  i;


        target->num_grays = 256;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_ARRAY_COPY( t, s, width );

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY2:
      {
        FT_UInt  i;


        target->num_grays = 4;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 2; j > 0; j-- )
          {
            FT_Int  val = ss[0];


            tt[0] = (FT_Byte)( ( val & 0xC0 ) >> 6 );
            tt[1] = (FT_Byte)( ( val & 0x30 ) >> 4 );
            tt[2] = (FT_Byte)( ( val & 0x0C ) >> 2 );
            tt[3] = (FT_Byte)( ( val & 0x03 ) );

            ss += 1;
            tt += 4;
          }

          j = source->width & 3;
          if ( j > 0 )
          {
            FT_Int  val = ss[0];


            for ( ; j > 0; j-- )
            {
              tt[0]  = (FT_Byte)( ( val & 0xC0 ) >> 6 );
              val  <<= 2;
              tt    += 1;
            }
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_GRAY4:
      {
        FT_UInt  i;


        target->num_grays = 16;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          /* get the full bytes */
          for ( j = source->width >> 1; j > 0; j-- )
          {
            FT_Int  val = ss[0];


            tt[0] = (FT_Byte)( ( val & 0xF0 ) >> 4 );
            tt[1] = (FT_Byte)( ( val & 0x0F ) );

            ss += 1;
            tt += 2;
          }

          if ( source->width & 1 )
            tt[0] = (FT_Byte)( ( ss[0] & 0xF0 ) >> 4 );

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;


    case FT_PIXEL_MODE_BGRA:
      {
        FT_UInt  i;


        target->num_grays = 256;

        for ( i = source->rows; i > 0; i-- )
        {
          FT_Byte*  ss = s;
          FT_Byte*  tt = t;
          FT_UInt   j;


          for ( j = source->width; j > 0; j-- )
          {
            tt[0] = ft_gray_for_premultiplied_srgb_bgra( ss );

            ss += 4;
            tt += 1;
          }

          s += source->pitch;
          t += target->pitch;
        }
      }
      break;

    default:
      ;
    }

    return error;
  }